

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::OptNonGreedy
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ee99b8;
    *puVar4 = 0;
  }
  EVar1 = *this->next;
  if (EVar1 == '?') {
    if (this->inputLim < this->next + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ee99b8;
      *puVar4 = 0;
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)*this->next < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar3) {
LAB_00ee99b8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    this->next = this->next + 1;
  }
  return EVar1 != '?';
}

Assistant:

bool Parser<P, IsLiteral>::OptNonGreedy()
    {
        // Could be terminating 0
        if (ECLookahead() != '?')
            return true;
        ECConsume();
        return false;
    }